

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::MultiVertexArrayCountTests::init
          (MultiVertexArrayCountTests *this,EVP_PKEY_CTX *ctx)

{
  GLValue max_;
  int extraout_EAX;
  MultiVertexArrayTest *this_00;
  long *extraout_RAX;
  long *plVar1;
  int iVar2;
  iterator this_01;
  long lVar3;
  GLValue GVar4;
  Spec spec;
  string desc;
  string name;
  undefined1 local_d8 [16];
  pointer local_c8;
  iterator iStack_c0;
  ArraySpec *local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  long *local_70 [2];
  long local_60 [2];
  GLValue local_50;
  GLValue local_40;
  
  lVar3 = 0;
  do {
    local_c8 = (pointer)0x0;
    iStack_c0._M_current = (ArraySpec *)0x0;
    local_b8 = (ArraySpec *)0x0;
    local_d8._0_4_ = PRIMITIVE_TRIANGLES;
    local_d8._4_4_ = 0x100;
    local_d8._8_4_ = 0;
    iVar2 = (&DAT_01bcc080)[lVar3];
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    do {
      GVar4 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      aStack_78 = GVar4.field_1;
      local_80 = GVar4.type;
      GVar4 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      aStack_88 = GVar4.field_1;
      local_90 = GVar4.type;
      max_._4_4_ = uStack_8c;
      max_.type = local_90;
      GVar4._4_4_ = uStack_7c;
      GVar4.type = local_80;
      GVar4.field_1 = aStack_78;
      max_.field_1 = aStack_88;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)local_70,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,STORAGE_USER,
                 USAGE_DYNAMIC_DRAW,2,0,0,false,GVar4,max_);
      if (iStack_c0._M_current == local_b8) {
        this_01._M_current = iStack_c0._M_current;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_c8,iStack_c0,(ArraySpec *)local_70);
      }
      else {
        ((iStack_c0._M_current)->max).type = local_40.type;
        *(undefined4 *)&((iStack_c0._M_current)->max).field_0x4 = local_40._4_4_;
        ((iStack_c0._M_current)->max).field_1 = local_40.field_1;
        ((iStack_c0._M_current)->min).type = local_50.type;
        *(undefined4 *)&((iStack_c0._M_current)->min).field_0x4 = local_50._4_4_;
        ((iStack_c0._M_current)->min).field_1 = local_50.field_1;
        (iStack_c0._M_current)->componentCount = (undefined4)local_60[0];
        (iStack_c0._M_current)->offset = local_60[0]._4_4_;
        (iStack_c0._M_current)->stride = (undefined4)local_60[1];
        (iStack_c0._M_current)->normalize = (bool)local_60[1]._4_1_;
        *(undefined3 *)&(iStack_c0._M_current)->field_0x1d = local_60[1]._5_3_;
        *(long **)iStack_c0._M_current = local_70[0];
        *(long **)&(iStack_c0._M_current)->storage = local_70[1];
        this_01._M_current = iStack_c0._M_current + 1;
        iStack_c0._M_current = this_01._M_current;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    getTestName_abi_cxx11_
              ((string *)local_70,(MultiVertexArrayCountTests *)this_01._M_current,(Spec *)local_d8)
    ;
    getTestName_abi_cxx11_
              (&local_b0,(MultiVertexArrayCountTests *)this_01._M_current,(Spec *)local_d8);
    this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,(Spec *)local_d8,
               (char *)local_70[0],local_b0._M_dataplus._M_p);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    plVar1 = local_60;
    if (local_70[0] != plVar1) {
      operator_delete(local_70[0],local_60[0] + 1);
      plVar1 = extraout_RAX;
    }
    iVar2 = (int)plVar1;
    if (local_c8 != (pointer)0x0) {
      operator_delete(local_c8,(long)local_b8 - (long)local_c8);
      iVar2 = extraout_EAX;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  return iVar2;
}

Assistant:

void MultiVertexArrayCountTests::init (void)
{
	// Test attribute counts
	int arrayCounts[] = {2, 3, 4, 5, 6, 7, 8};

	for (int arrayCountNdx = 0; arrayCountNdx < DE_LENGTH_OF_ARRAY(arrayCounts); arrayCountNdx++)
	{
		MultiVertexArrayTest::Spec spec;

		spec.primitive	= Array::PRIMITIVE_TRIANGLES;
		spec.drawCount	= 256;
		spec.first		= 0;

		for (int arrayNdx = 0; arrayNdx < arrayCounts[arrayCountNdx]; arrayNdx++)
		{
			MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
															Array::OUTPUTTYPE_VEC2,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															2,
															0,
															0,
															false,
															GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
															GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

			spec.arrays.push_back(arraySpec);
		}

		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);

		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
	}
}